

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

Context * Rml::CreateContext(String *name,Vector2i dimensions,
                            RenderInterface *render_interface_for_context,
                            TextInputHandler *text_input_handler_for_context)

{
  ContextPtr CVar1;
  Context *pCVar2;
  CoreData *pCVar3;
  __uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *this;
  __uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_> *this_00;
  RenderManager *render_manager;
  pointer pcVar4;
  char *fmt;
  _Head_base<0UL,_Rml::Context_*,_false> context;
  ContextPtr new_context;
  RenderInterface *render_interface_for_context_local;
  
  if (initialised != '\x01') {
    return (Context *)0x0;
  }
  if (render_interface_for_context == (RenderInterface *)0x0) {
    render_interface_for_context_local = render_interface;
    if (text_input_handler_for_context == (TextInputHandler *)0x0) {
      text_input_handler_for_context = text_input_handler;
    }
    if (render_interface == (RenderInterface *)0x0) {
      pcVar4 = (name->_M_dataplus)._M_p;
      fmt = 
      "Failed to create context \'%s\', no render interface specified and no default render interface exists."
      ;
      goto LAB_0025d3e5;
    }
  }
  else {
    render_interface_for_context_local = render_interface_for_context;
    if (text_input_handler_for_context == (TextInputHandler *)0x0) {
      text_input_handler_for_context = text_input_handler;
    }
  }
  pCVar2 = GetContext(name);
  if (pCVar2 == (Context *)0x0) {
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    this = (__uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
           itlib::
           flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
           ::operator[]<Rml::RenderInterface*&>
                     ((flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
                       *)&pCVar3->render_managers,&render_interface_for_context_local);
    render_manager =
         (this->_M_t).
         super__Tuple_impl<0UL,_Rml::RenderManager_*,_std::default_delete<Rml::RenderManager>_>.
         super__Head_base<0UL,_Rml::RenderManager_*,_false>._M_head_impl;
    if (render_manager == (RenderManager *)0x0) {
      ::std::make_unique<Rml::RenderManager,Rml::RenderInterface*&>
                ((RenderInterface **)&new_context);
      CVar1 = new_context;
      new_context._M_t.super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
      super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl =
           (__uniq_ptr_data<Rml::Context,_Rml::Releaser<Rml::Context>,_true,_true>)
           (__uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>)0x0;
      ::std::__uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::reset
                (this,(pointer)CVar1._M_t.
                               super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
                               super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl);
      ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::~unique_ptr
                ((unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
                 &new_context);
      render_manager =
           (this->_M_t).
           super__Tuple_impl<0UL,_Rml::RenderManager_*,_std::default_delete<Rml::RenderManager>_>.
           super__Head_base<0UL,_Rml::RenderManager_*,_false>._M_head_impl;
    }
    Factory::InstanceContext
              ((Factory *)&new_context,name,render_manager,text_input_handler_for_context);
    if ((__uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>)
        new_context._M_t.super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
        super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>)0x0) {
      context._M_head_impl = (Context *)0x0;
      Log::Message(LT_WARNING,"Failed to instance context \'%s\', instancer returned nullptr.",
                   (name->_M_dataplus)._M_p);
    }
    else {
      Context::SetDimensions
                ((Context *)
                 new_context._M_t.super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>.
                 _M_t.super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
                 super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl,dimensions);
      context._M_head_impl = (Context *)new_context;
      pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                         ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
      this_00 = (__uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_> *)
                robin_hood::detail::
                Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                ::
                doCreateByKey<std::__cxx11::string_const&,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>>
                          ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                            *)&pCVar3->contexts,name);
      CVar1 = new_context;
      new_context._M_t.super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
      super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl =
           (__uniq_ptr_data<Rml::Context,_Rml::Releaser<Rml::Context>,_true,_true>)
           (__uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>)0x0;
      ::std::__uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>::reset
                (this_00,(pointer)CVar1._M_t.
                                  super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>
                                  .super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl);
      PluginRegistry::NotifyContextCreate(context._M_head_impl);
    }
    ::std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>::~unique_ptr(&new_context);
    return (Context *)(tuple<Rml::Context_*,_Rml::Releaser<Rml::Context>_>)context._M_head_impl;
  }
  pcVar4 = (name->_M_dataplus)._M_p;
  fmt = "Failed to create context \'%s\', context already exists.";
LAB_0025d3e5:
  Log::Message(LT_WARNING,fmt,pcVar4);
  return (Context *)0x0;
}

Assistant:

Context* CreateContext(const String& name, const Vector2i dimensions, RenderInterface* render_interface_for_context,
	TextInputHandler* text_input_handler_for_context)
{
	if (!initialised)
		return nullptr;

	if (!render_interface_for_context)
		render_interface_for_context = render_interface;

	if (!text_input_handler_for_context)
		text_input_handler_for_context = text_input_handler;

	if (!render_interface_for_context)
	{
		Log::Message(Log::LT_WARNING, "Failed to create context '%s', no render interface specified and no default render interface exists.",
			name.c_str());
		return nullptr;
	}

	if (GetContext(name))
	{
		Log::Message(Log::LT_WARNING, "Failed to create context '%s', context already exists.", name.c_str());
		return nullptr;
	}

	// Each unique render interface gets its own render manager.
	auto& render_manager = core_data->render_managers[render_interface_for_context];
	if (!render_manager)
		render_manager = MakeUnique<RenderManager>(render_interface_for_context);

	ContextPtr new_context = Factory::InstanceContext(name, render_manager.get(), text_input_handler_for_context);
	if (!new_context)
	{
		Log::Message(Log::LT_WARNING, "Failed to instance context '%s', instancer returned nullptr.", name.c_str());
		return nullptr;
	}

	new_context->SetDimensions(dimensions);

	Context* new_context_raw = new_context.get();
	core_data->contexts[name] = std::move(new_context);

	PluginRegistry::NotifyContextCreate(new_context_raw);

	return new_context_raw;
}